

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O2

void Pf_StoCreateGateAdd(Pf_Man_t *pMan,word uTruth,int *pFans,int nFans,int CellId)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  ulong uVar4;
  Vec_Wec_t *p_00;
  byte bVar5;
  uint Entry;
  ulong uVar6;
  word uFunc;
  ulong local_38;
  
  uVar6 = (ulong)((uint)uTruth & 1);
  local_38 = -uVar6 ^ uTruth;
  iVar1 = Vec_MemHashInsert(pMan->vTtMem,&local_38);
  p_00 = pMan->vTt2Match;
  if (iVar1 == p_00->nSize) {
    Vec_WecPushLevel(p_00);
    p_00 = pMan->vTt2Match;
  }
  p = Vec_WecEntry(p_00,iVar1);
  if (6 < nFans) {
    __assert_fail("nFans < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                  ,0x9e,"void Pf_StoCreateGateAdd(Pf_Man_t *, word, int *, int, int)");
  }
  bVar5 = 0;
  if (nFans < 1) {
    nFans = 0;
  }
  for (uVar4 = 0; Entry = (uint)uVar6, (uint)nFans != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = Abc_Lit2Var(pFans[uVar4]);
    iVar2 = Abc_LitIsCompl(pFans[uVar4]);
    uVar6 = (ulong)(Entry & 0xffffc0ff | (iVar1 << (bVar5 & 0x1f)) << 0xe |
                   ((iVar2 << ((byte)uVar4 & 0x1f)) << 8 | Entry) & 0x3f00);
    bVar5 = bVar5 + 3;
  }
  iVar1 = 0;
  do {
    iVar2 = p->nSize;
    if (iVar2 <= iVar1 + 1) {
LAB_005b503e:
      if (iVar2 == iVar1) {
        Vec_IntPush(p,CellId);
        Vec_IntPush(p,Entry);
        return;
      }
      return;
    }
    iVar2 = Vec_IntEntry(p,iVar1);
    uVar3 = Vec_IntEntry(p,iVar1 + 1);
    if ((iVar2 == CellId) && (((uVar3 ^ Entry) & 0x3f00) == 0)) {
      iVar2 = p->nSize;
      goto LAB_005b503e;
    }
    iVar1 = iVar1 + 2;
  } while( true );
}

Assistant:

void Pf_StoCreateGateAdd( Pf_Man_t * pMan, word uTruth, int * pFans, int nFans, int CellId )
{
    Vec_Int_t * vArray;
    Pf_Mat_t Mat = Pf_Int2Mat(0);
    int i, GateId, Entry, fCompl = (int)(uTruth & 1);
    word uFunc = fCompl ? ~uTruth : uTruth;
    int iFunc = Vec_MemHashInsert( pMan->vTtMem, &uFunc );
    if ( iFunc == Vec_WecSize(pMan->vTt2Match) )
        Vec_WecPushLevel( pMan->vTt2Match );
    vArray = Vec_WecEntry( pMan->vTt2Match, iFunc );
    Mat.fCompl = fCompl;
    assert( nFans < 7 );
    for ( i = 0; i < nFans; i++ )
    {
        Mat.Perm  |= (unsigned)(Abc_Lit2Var(pFans[i]) << (3*i));
        Mat.Phase |= (unsigned)(Abc_LitIsCompl(pFans[i]) << i);
    }
    // check if the same one exists
    Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
        if ( GateId == CellId && Pf_Int2Mat(Entry).Phase == Mat.Phase )
            break;
    if ( i == Vec_IntSize(vArray) )
    {
        Vec_IntPush( vArray, CellId );
        Vec_IntPush( vArray, Pf_Mat2Int(Mat) );
    }
}